

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O2

void __thiscall PClass::DestroySpecials(PClass *this,void *addr)

{
  long lVar1;
  pair<const_PType_*,_unsigned_int> *ppVar2;
  
  if (this->bRuntimeClass == true) {
    if (this->ParentClass == (PClass *)0x0) {
      __assert_fail("ParentClass != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobjtype.cpp"
                    ,0xc78,"void PClass::DestroySpecials(void *) const");
    }
    DestroySpecials(this->ParentClass,addr);
    ppVar2 = (this->SpecialInits).Array;
    for (lVar1 = (ulong)(this->SpecialInits).Count << 4; lVar1 != 0; lVar1 = lVar1 + -0x10) {
      (*(ppVar2->first->super_PTypeBase).super_DObject._vptr_DObject[0xe])
                (ppVar2->first,(ulong)ppVar2->second + (long)addr);
      ppVar2 = ppVar2 + 1;
    }
  }
  return;
}

Assistant:

void PClass::DestroySpecials(void *addr) const
{
	// Once we reach a native class, we can stop going up the family tree,
	// since native classes handle deinitialization natively.
	if (!bRuntimeClass)
	{
		return;
	}
	assert(ParentClass != NULL);
	ParentClass->DestroySpecials(addr);
	for (auto tao : SpecialInits)
	{
		tao.first->DestroyValue((BYTE *)addr + tao.second);
	}
}